

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

int google::protobuf::Base64UnescapeInternal
              (char *src_param,int szsrc,char *dest,int szdest,char *unbase64)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  byte *pbVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  if (dest == (char *)0x0) {
    if (szsrc < 4) goto LAB_001ddcc5;
    uVar12 = 0;
    uVar6 = 0;
    do {
      iVar5 = szsrc;
      if (((((ulong)(byte)*src_param == 0) || ((ulong)((byte *)src_param)[1] == 0)) ||
          ((ulong)((byte *)src_param)[2] == 0)) ||
         (uVar12 = (int)unbase64[((byte *)src_param)[3]] |
                   (int)unbase64[((byte *)src_param)[2]] << 6 |
                   (int)unbase64[((byte *)src_param)[1]] << 0xc |
                   (int)unbase64[(byte)*src_param] << 0x12, (int)uVar12 < 0)) {
        while( true ) {
          szsrc = iVar5 + -1;
          bVar2 = *src_param;
          cVar1 = unbase64[bVar2];
          src_param = (char *)((byte *)src_param + 1);
          iVar8 = szsrc;
          if (-1 < cVar1) break;
          if (((0x20 < bVar2) || ((0x100003e00U >> (bVar2 & 0x3f) & 1) == 0)) ||
             (bVar3 = iVar5 < 5, iVar5 = szsrc, bVar3)) {
            uVar10 = 0;
            goto LAB_001ddd05;
          }
        }
        while( true ) {
          szsrc = iVar8 + -1;
          bVar2 = *src_param;
          uVar9 = (uint)bVar2;
          uVar7 = (uint)unbase64[bVar2];
          src_param = (char *)((byte *)src_param + 1);
          if (-1 < unbase64[bVar2]) break;
          if (((0x20 < bVar2) || ((0x100003e00U >> (bVar2 & 0x3f) & 1) == 0)) ||
             (bVar3 = iVar8 < 4, iVar8 = szsrc, bVar3)) goto LAB_001ddcdf;
        }
        while( true ) {
          iVar5 = szsrc + -1;
          bVar2 = *src_param;
          cVar1 = unbase64[bVar2];
          src_param = (char *)((byte *)src_param + 1);
          if (-1 < cVar1) break;
          if (((0x20 < bVar2) || ((0x100003e00U >> (bVar2 & 0x3f) & 1) == 0)) ||
             (bVar3 = szsrc < 3, szsrc = iVar5, bVar3)) {
            uVar10 = 2;
            szsrc = iVar5;
LAB_001ddd05:
            uVar9 = (uint)bVar2;
            uVar7 = (uint)cVar1;
            goto LAB_001ddd08;
          }
        }
        while( true ) {
          szsrc = iVar5 + -1;
          bVar2 = *src_param;
          uVar11 = (uint)bVar2;
          uVar9 = (uint)bVar2;
          src_param = (char *)((byte *)src_param + 1);
          uVar7 = (uint)unbase64[bVar2];
          if (-1 < unbase64[bVar2]) break;
          uVar9 = uVar11;
          if (((0x20 < bVar2) || ((0x100003e00U >> (bVar2 & 0x3f) & 1) == 0)) ||
             (bVar3 = iVar5 < 2, iVar5 = szsrc, bVar3)) goto LAB_001ddcf7;
        }
      }
      else {
        szsrc = szsrc + -4;
        src_param = (char *)((byte *)src_param + 4);
        uVar9 = 0;
        uVar7 = 0xffffffff;
      }
      uVar6 = (ulong)((int)uVar6 + 3);
      uVar10 = 0;
    } while (3 < szsrc);
  }
  else if (szsrc < 4) {
LAB_001ddcc5:
    uVar7 = 0;
    uVar6 = 0;
    uVar10 = 0;
    uVar9 = 0;
    uVar12 = 0;
  }
  else {
    uVar6 = 0;
    uVar11 = 0;
    do {
      iVar5 = szsrc;
      if ((((ulong)(byte)*src_param == 0) || ((ulong)((byte *)src_param)[1] == 0)) ||
         (((ulong)((byte *)src_param)[2] == 0 ||
          (uVar11 = (int)unbase64[((byte *)src_param)[3]] |
                    (int)unbase64[((byte *)src_param)[2]] << 6 |
                    (int)unbase64[((byte *)src_param)[1]] << 0xc |
                    (int)unbase64[(byte)*src_param] << 0x12, (int)uVar11 < 0)))) {
        while( true ) {
          szsrc = iVar5 + -1;
          bVar2 = *src_param;
          uVar9 = (uint)bVar2;
          src_param = (char *)((byte *)src_param + 1);
          uVar12 = (uint)unbase64[bVar2];
          iVar8 = szsrc;
          if (-1 < unbase64[bVar2]) break;
          uVar7 = uVar12;
          if (((0x20 < bVar2) || ((0x100003e00U >> (bVar2 & 0x3f) & 1) == 0)) ||
             (bVar3 = iVar5 < 5, iVar5 = szsrc, bVar3)) goto LAB_001ddcda;
        }
        while( true ) {
          szsrc = iVar8 + -1;
          bVar2 = *src_param;
          uVar9 = (uint)bVar2;
          src_param = (char *)((byte *)src_param + 1);
          uVar7 = (uint)unbase64[bVar2];
          if (-1 < unbase64[bVar2]) break;
          if (((0x20 < bVar2) || ((0x100003e00U >> (bVar2 & 0x3f) & 1) == 0)) ||
             (bVar3 = iVar8 < 4, iVar8 = szsrc, bVar3)) goto LAB_001ddcdf;
        }
        uVar12 = uVar12 << 6 | uVar7;
        iVar5 = szsrc;
        while( true ) {
          szsrc = iVar5 + -1;
          bVar2 = *src_param;
          uVar9 = (uint)bVar2;
          src_param = (char *)((byte *)src_param + 1);
          uVar7 = (uint)unbase64[bVar2];
          if (-1 < unbase64[bVar2]) break;
          if (((0x20 < bVar2) || ((0x100003e00U >> (bVar2 & 0x3f) & 1) == 0)) ||
             (bVar3 = iVar5 < 3, iVar5 = szsrc, bVar3)) {
            uVar10 = 2;
            goto LAB_001ddd08;
          }
        }
        uVar12 = uVar12 << 6 | uVar7;
        iVar5 = szsrc;
        while( true ) {
          szsrc = iVar5 + -1;
          bVar2 = *src_param;
          uVar11 = (uint)bVar2;
          uVar9 = (uint)bVar2;
          src_param = (char *)((byte *)src_param + 1);
          uVar7 = (uint)unbase64[bVar2];
          if (-1 < unbase64[bVar2]) break;
          uVar9 = uVar11;
          if (((0x20 < bVar2) || ((0x100003e00U >> (bVar2 & 0x3f) & 1) == 0)) ||
             (bVar3 = iVar5 < 2, iVar5 = szsrc, bVar3)) goto LAB_001ddcf7;
        }
        uVar11 = uVar12 << 6 | uVar7;
      }
      else {
        szsrc = szsrc + -4;
        src_param = (char *)((byte *)src_param + 4);
        uVar9 = 0;
        uVar7 = 0xffffffff;
      }
      uVar10 = uVar6 + 3;
      if (szdest < (int)uVar10) {
        return -1;
      }
      *(ushort *)(dest + uVar6 + 1) = (ushort)uVar11 << 8 | (ushort)uVar11 >> 8;
      uVar12 = uVar11 >> 0x10;
      dest[uVar6] = (char)(uVar11 >> 0x10);
      uVar6 = uVar10;
      uVar11 = uVar12;
    } while (3 < szsrc);
    uVar6 = uVar10 & 0xffffffff;
LAB_001ddcda:
    uVar10 = 0;
    uVar12 = uVar11;
  }
  goto LAB_001ddd08;
LAB_001ddcf7:
  uVar10 = 3;
  goto LAB_001ddd08;
LAB_001ddcdf:
  uVar10 = 1;
LAB_001ddd08:
  if ((int)uVar7 < 0) {
    if ((uVar9 == 0x3d) || (uVar9 == 0x2e)) goto LAB_001ddddb;
    if (uVar9 == 0) goto LAB_001ddd3a;
    if ((4 < uVar9 - 9) && (uVar9 != 0x20)) {
      return -1;
    }
  }
  if ((uVar9 != 0x3d) && (uVar9 != 0x2e)) {
LAB_001ddd3a:
    pbVar4 = (byte *)src_param;
    iVar5 = szsrc;
    iVar8 = szsrc;
    if (0 < szsrc) {
      do {
        while( true ) {
          szsrc = iVar5;
          src_param = (char *)pbVar4;
          bVar2 = *src_param;
          if (-1 < unbase64[bVar2]) break;
          if (4 < bVar2 - 9) {
            if (0x2d < bVar2) {
              if ((bVar2 != 0x2e) && (bVar2 != 0x3d)) {
                return -1;
              }
              goto LAB_001dddfe;
            }
            if (bVar2 != 0x20) {
              if (bVar2 != 0) {
                return -1;
              }
              iVar5 = (*(code *)((long)&DAT_00255390 + (long)(int)(&DAT_00255390)[uVar10]))
                                ((byte *)src_param + 1,szsrc + -1,uVar6,(byte *)src_param + 1,
                                 (code *)((long)&DAT_00255390 + (long)(int)(&DAT_00255390)[uVar10]))
              ;
              return iVar5;
            }
          }
          pbVar4 = (byte *)src_param + 1;
          iVar5 = szsrc + -1;
          if (szsrc < 2) {
            iVar5 = 1;
            if (iVar8 < 1) {
              iVar5 = iVar8;
            }
            iVar5 = (*(code *)((long)&DAT_00255390 + (long)(int)(&DAT_00255390)[uVar10]))
                              ((byte *)src_param + 1,iVar5 + -1);
            return iVar5;
          }
        }
        uVar7 = uVar12 << 6;
        uVar12 = (int)unbase64[bVar2] | uVar7;
        uVar9 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar9;
        if (uVar9 == 4) {
          iVar5 = (int)uVar6;
          if (dest != (char *)0x0) {
            if (szdest < iVar5 + 3) {
              return -1;
            }
            dest[(long)iVar5 + 2] = (char)uVar12;
            dest[(long)iVar5 + 1] = (char)(uVar7 >> 8);
            dest[iVar5] = (char)(uVar7 >> 0x10);
          }
          uVar6 = (ulong)(iVar5 + 3);
          uVar10 = 0;
          uVar12 = 0;
        }
        iVar8 = szsrc + -1;
        pbVar4 = (byte *)src_param + 1;
        iVar5 = iVar8;
      } while (1 < szsrc);
      src_param = (char *)((byte *)src_param + 1);
      szsrc = szsrc + -1;
    }
LAB_001dddfe:
    iVar5 = (*(code *)((long)&DAT_00255390 + (long)(int)(&DAT_00255390)[uVar10]))
                      (src_param,szsrc,uVar6,src_param,
                       (code *)((long)&DAT_00255390 + (long)(int)(&DAT_00255390)[uVar10]));
    return iVar5;
  }
LAB_001ddddb:
  iVar5 = (*(code *)((long)&DAT_00255390 + (long)(int)(&DAT_00255390)[uVar10]))
                    ((byte *)src_param + -1,szsrc + 1,uVar6,
                     (code *)((long)&DAT_00255390 + (long)(int)(&DAT_00255390)[uVar10]));
  return iVar5;
}

Assistant:

int Base64UnescapeInternal(const char *src_param, int szsrc,
                           char *dest, int szdest,
                           const signed char* unbase64) {
  static const char kPad64Equals = '=';
  static const char kPad64Dot = '.';

  int decode = 0;
  int destidx = 0;
  int state = 0;
  unsigned int ch = 0;
  unsigned int temp = 0;

  // If "char" is signed by default, using *src as an array index results in
  // accessing negative array elements. Treat the input as a pointer to
  // unsigned char to avoid this.
  const unsigned char *src = reinterpret_cast<const unsigned char*>(src_param);

  // The GET_INPUT macro gets the next input character, skipping
  // over any whitespace, and stopping when we reach the end of the
  // string or when we read any non-data character.  The arguments are
  // an arbitrary identifier (used as a label for goto) and the number
  // of data bytes that must remain in the input to avoid aborting the
  // loop.
#define GET_INPUT(label, remain)                 \
  label:                                         \
    --szsrc;                                     \
    ch = *src++;                                 \
    decode = unbase64[ch];                       \
    if (decode < 0) {                            \
      if (ascii_isspace(ch) && szsrc >= remain)  \
        goto label;                              \
      state = 4 - remain;                        \
      break;                                     \
    }

  // if dest is null, we're just checking to see if it's legal input
  // rather than producing output.  (I suspect this could just be done
  // with a regexp...).  We duplicate the loop so this test can be
  // outside it instead of in every iteration.

  if (dest) {
    // This loop consumes 4 input bytes and produces 3 output bytes
    // per iteration.  We can't know at the start that there is enough
    // data left in the string for a full iteration, so the loop may
    // break out in the middle; if so 'state' will be set to the
    // number of input bytes read.

    while (szsrc >= 4)  {
      // We'll start by optimistically assuming that the next four
      // bytes of the string (src[0..3]) are four good data bytes
      // (that is, no nulls, whitespace, padding chars, or illegal
      // chars).  We need to test src[0..2] for nulls individually
      // before constructing temp to preserve the property that we
      // never read past a null in the string (no matter how long
      // szsrc claims the string is).

      if (!src[0] || !src[1] || !src[2] ||
          (temp = ((unsigned(unbase64[src[0]]) << 18) |
                   (unsigned(unbase64[src[1]]) << 12) |
                   (unsigned(unbase64[src[2]]) << 6) |
                   (unsigned(unbase64[src[3]])))) & 0x80000000) {
        // Iff any of those four characters was bad (null, illegal,
        // whitespace, padding), then temp's high bit will be set
        // (because unbase64[] is -1 for all bad characters).
        //
        // We'll back up and resort to the slower decoder, which knows
        // how to handle those cases.

        GET_INPUT(first, 4);
        temp = decode;
        GET_INPUT(second, 3);
        temp = (temp << 6) | decode;
        GET_INPUT(third, 2);
        temp = (temp << 6) | decode;
        GET_INPUT(fourth, 1);
        temp = (temp << 6) | decode;
      } else {
        // We really did have four good data bytes, so advance four
        // characters in the string.

        szsrc -= 4;
        src += 4;
        decode = -1;
        ch = '\0';
      }

      // temp has 24 bits of input, so write that out as three bytes.

      if (destidx+3 > szdest) return -1;
      dest[destidx+2] = temp;
      temp >>= 8;
      dest[destidx+1] = temp;
      temp >>= 8;
      dest[destidx] = temp;
      destidx += 3;
    }
  } else {
    while (szsrc >= 4)  {
      if (!src[0] || !src[1] || !src[2] ||
          (temp = ((unsigned(unbase64[src[0]]) << 18) |
                   (unsigned(unbase64[src[1]]) << 12) |
                   (unsigned(unbase64[src[2]]) << 6) |
                   (unsigned(unbase64[src[3]])))) & 0x80000000) {
        GET_INPUT(first_no_dest, 4);
        GET_INPUT(second_no_dest, 3);
        GET_INPUT(third_no_dest, 2);
        GET_INPUT(fourth_no_dest, 1);
      } else {
        szsrc -= 4;
        src += 4;
        decode = -1;
        ch = '\0';
      }
      destidx += 3;
    }
  }

#undef GET_INPUT

  // if the loop terminated because we read a bad character, return
  // now.
  if (decode < 0 && ch != '\0' &&
      ch != kPad64Equals && ch != kPad64Dot && !ascii_isspace(ch))
    return -1;

  if (ch == kPad64Equals || ch == kPad64Dot) {
    // if we stopped by hitting an '=' or '.', un-read that character -- we'll
    // look at it again when we count to check for the proper number of
    // equals signs at the end.
    ++szsrc;
    --src;
  } else {
    // This loop consumes 1 input byte per iteration.  It's used to
    // clean up the 0-3 input bytes remaining when the first, faster
    // loop finishes.  'temp' contains the data from 'state' input
    // characters read by the first loop.
    while (szsrc > 0)  {
      --szsrc;
      ch = *src++;
      decode = unbase64[ch];
      if (decode < 0) {
        if (ascii_isspace(ch)) {
          continue;
        } else if (ch == '\0') {
          break;
        } else if (ch == kPad64Equals || ch == kPad64Dot) {
          // back up one character; we'll read it again when we check
          // for the correct number of pad characters at the end.
          ++szsrc;
          --src;
          break;
        } else {
          return -1;
        }
      }

      // Each input character gives us six bits of output.
      temp = (temp << 6) | decode;
      ++state;
      if (state == 4) {
        // If we've accumulated 24 bits of output, write that out as
        // three bytes.
        if (dest) {
          if (destidx+3 > szdest) return -1;
          dest[destidx+2] = temp;
          temp >>= 8;
          dest[destidx+1] = temp;
          temp >>= 8;
          dest[destidx] = temp;
        }
        destidx += 3;
        state = 0;
        temp = 0;
      }
    }
  }

  // Process the leftover data contained in 'temp' at the end of the input.
  int expected_equals = 0;
  switch (state) {
    case 0:
      // Nothing left over; output is a multiple of 3 bytes.
      break;

    case 1:
      // Bad input; we have 6 bits left over.
      return -1;

    case 2:
      // Produce one more output byte from the 12 input bits we have left.
      if (dest) {
        if (destidx+1 > szdest) return -1;
        temp >>= 4;
        dest[destidx] = temp;
      }
      ++destidx;
      expected_equals = 2;
      break;

    case 3:
      // Produce two more output bytes from the 18 input bits we have left.
      if (dest) {
        if (destidx+2 > szdest) return -1;
        temp >>= 2;
        dest[destidx+1] = temp;
        temp >>= 8;
        dest[destidx] = temp;
      }
      destidx += 2;
      expected_equals = 1;
      break;

    default:
      // state should have no other values at this point.
      GOOGLE_LOG(FATAL) << "This can't happen; base64 decoder state = " << state;
  }

  // The remainder of the string should be all whitespace, mixed with
  // exactly 0 equals signs, or exactly 'expected_equals' equals
  // signs.  (Always accepting 0 equals signs is a google extension
  // not covered in the RFC, as is accepting dot as the pad character.)

  int equals = 0;
  while (szsrc > 0 && *src) {
    if (*src == kPad64Equals || *src == kPad64Dot)
      ++equals;
    else if (!ascii_isspace(*src))
      return -1;
    --szsrc;
    ++src;
  }

  return (equals == 0 || equals == expected_equals) ? destidx : -1;
}